

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  uint32_t uVar1;
  uint32_t uVar2;
  Variant *pVVar3;
  bool bVar4;
  bool bVar5;
  ExecutionModel EVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  Bitset *pBVar10;
  char *pcVar11;
  byte bVar12;
  char *addr_space;
  Bitset flags;
  char *local_d0;
  SPIRVariable *local_c8;
  Bitset local_b8;
  undefined1 local_78 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  char **local_38;
  
  local_78 = (undefined1  [8])0x0;
  local_70._M_buckets = &(((Bitset *)local_78)->higher)._M_h._M_single_bucket;
  local_70._M_bucket_count = 1;
  local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70._M_element_count = 0;
  local_70._M_rehash_policy._M_max_load_factor = 1.0;
  local_70._M_rehash_policy._M_next_resize = 0;
  local_70._M_single_bucket = (__node_base_ptr)0x0;
  uVar9 = (ulong)id;
  if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar9].type == TypeVariable)) {
    local_c8 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar9);
    bVar12 = 1;
    if ((*(int *)&(type->super_IVariant).field_0xc != 0xf) ||
       ((bVar4 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
        !bVar4 && (bVar4 = Compiler::has_decoration
                                     ((Compiler *)this,(ID)(type->super_IVariant).self.id,
                                      DecorationBufferBlock), !bVar4)))) goto LAB_002bdc30;
    Compiler::get_buffer_block_flags(&local_b8,(Compiler *)this,(VariableID)id);
    local_78 = (undefined1  [8])local_b8.lower;
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign(&(((Bitset *)local_78)->higher)._M_h,&local_b8.higher);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_b8.higher._M_h);
    bVar12 = 1;
  }
  else {
    bVar12 = 0;
    local_c8 = (SPIRVariable *)0x0;
LAB_002bdc30:
    pBVar10 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    local_78 = (undefined1  [8])pBVar10->lower;
    if (pBVar10 != (Bitset *)local_78) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&((Bitset *)local_78)->higher,&(pBVar10->higher)._M_h);
    }
  }
  local_b8.lower = 0;
  switch(type->storage) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case StorageClassPushConstant:
    iVar8 = *(int *)&(type->super_IVariant).field_0xc;
    if (iVar8 == 0xf) {
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
      pcVar11 = "const device";
      if (((uint)local_78._0_4_ >> 0x18 & 1) == 0) {
        pcVar11 = "device";
      }
      local_b8.lower = (uint64_t)"constant";
      if (bVar4) {
        local_b8.lower = (uint64_t)pcVar11;
      }
      goto LAB_002bdf31;
    }
    if (!argument) {
      local_b8.lower = 0x36d6f9;
      goto LAB_002bdf31;
    }
    if (((iVar8 == 0x10) && ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      local_b8.lower = 0x35713a;
      goto LAB_002bdf31;
    }
    break;
  case StorageClassInput:
    EVar6 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar6 == ExecutionModelTessellationControl && (bVar12 ^ 1) == 0) &&
       ((local_c8->basevariable).id == (this->stage_in_ptr_var_id).id)) {
      local_d0 = "threadgroup";
      local_b8.lower = (uint64_t)local_d0;
      if ((this->msl_options).multi_patch_workgroup != false) {
        local_d0 = "const device";
        local_b8.lower = (uint64_t)local_d0;
      }
    }
    else {
      local_d0 = (char *)0x0;
    }
    EVar6 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar6 == ExecutionModelTessellationEvaluation) &&
       ((bVar12 & (this->msl_options).raw_buffer_tese_input) != 0)) {
      uVar1 = (local_c8->basevariable).id;
      uVar2 = (this->stage_in_ptr_var_id).id;
      bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(local_c8->super_IVariant).self.id,DecorationPatch);
      bVar5 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(local_c8->super_IVariant).self.id,DecorationBuiltIn);
      uVar7 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(local_c8->super_IVariant).self.id,DecorationBuiltIn);
      if ((uVar1 == uVar2) || (bVar4 && (!bVar5 || 1 < uVar7 - 0xb))) {
        local_d0 = "const device";
        local_b8.lower = 0x36d6b1;
      }
    }
    EVar6 = Compiler::get_execution_model((Compiler *)this);
    if (((bVar12 ^ 1) == 0 && EVar6 == ExecutionModelFragment) &&
       ((local_c8->basevariable).id == (this->stage_in_var_id).id)) {
LAB_002bdeb6:
      local_b8.lower = 0x36d5f7;
      goto LAB_002bdf31;
    }
    if (local_d0 != (char *)0x0) goto LAB_002bdf31;
    break;
  case StorageClassOutput:
    if (this->capture_output_to_buffer == true) {
      if (bVar12 != 0) {
        bVar4 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,local_c8);
        if (bVar4) {
          bVar4 = Compiler::is_tessellation_shader((Compiler *)this);
          if (!bVar4) goto LAB_002bdeb6;
        }
        else {
          iVar8 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,local_c8,4)
          ;
          if ((char)iVar8 == '\0') {
            if ((char *)local_b8.lower != (char *)0x0) goto LAB_002bdf31;
            goto LAB_002bdf25;
          }
        }
switchD_002bdc84_caseD_4:
        local_b8.lower = 0x36d72a;
        goto LAB_002bdf31;
      }
      goto LAB_002bdf25;
    }
    break;
  case StorageClassWorkgroup:
    goto switchD_002bdc84_caseD_4;
  case StorageClassCrossWorkgroup:
  case StorageClassPrivate:
  case StorageClassFunction:
  case StorageClassGeneric:
  case StorageClassAtomicCounter:
  case StorageClassImage:
    break;
  case StorageClassStorageBuffer:
switchD_002bdc84_caseD_c:
    if ((bVar12 == 0) ||
       (bVar4 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
       bVar4)) {
      local_b8.lower = 0x36d6b1;
      if (((ulong)local_78 & 0x1000000) == 0) {
        local_b8.lower = 0x36d677;
      }
      goto LAB_002bdf31;
    }
LAB_002bdf25:
    local_b8.lower = 0x36d677;
    goto LAB_002bdf31;
  default:
    if (type->storage == StorageClassPhysicalStorageBuffer) goto switchD_002bdc84_caseD_c;
  }
  local_b8.lower = 0x35713a;
  if (*(int *)&(type->super_IVariant).field_0xc == 0x15) {
    local_b8.lower = 0x36d5f7;
  }
  if (!argument) {
    local_b8.lower = 0x35713a;
  }
  if (type->pointer != false) {
    local_b8.lower = 0x36d5f7;
  }
LAB_002bdf31:
  local_38 = (char **)0x377172;
  if (((ulong)local_78 & 0xa00000) == 0) {
    local_38 = (char **)0x35713a;
  }
  join<char_const*,char_const*&>
            (__return_storage_ptr__,(spirv_cross *)&local_38,(char **)&local_b8,local_38);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(((Bitset *)local_78)->higher)._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	return join(flags.get(DecorationVolatile) || flags.get(DecorationCoherent) ? "volatile " : "", addr_space);
}